

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_suite.cpp
# Opt level: O0

void replace_array(void)

{
  size_type in_RCX;
  undefined1 *puVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  basic_variable<std::allocator<char>_> *local_17a0;
  basic_variable<std::allocator<char>_> *local_1788;
  basic_variable<std::allocator<char>_> *local_1770;
  basic_variable<std::allocator<char>_> *local_1758;
  basic_variable<std::allocator<char>_> *local_1740;
  basic_variable<std::allocator<char>_> *local_1728;
  basic_variable<std::allocator<char>_> *local_1710;
  basic_variable<std::allocator<char>_> *local_16f8;
  basic_variable<std::allocator<char>_> *local_16e0;
  iterator local_16d0;
  iterator local_16b8;
  iterator local_16a0;
  iterator local_1688;
  nullable local_166c [7];
  basic_variable<std::allocator<char>_> *local_1650;
  basic_variable<std::allocator<char>_> local_1648;
  basic_variable<std::allocator<char>_> local_1618;
  basic_variable<std::allocator<char>_> local_15e8;
  basic_variable<std::allocator<char>_> local_15b8;
  basic_variable<std::allocator<char>_> local_1588;
  basic_variable<std::allocator<char>_> local_1558;
  basic_variable<std::allocator<char>_> local_1528;
  undefined1 local_14f8 [24];
  variable expect_7;
  basic_variable<std::allocator<char>_> local_1488;
  iterator local_1450;
  iterator local_1438;
  iterator local_1418;
  iterator local_1400;
  iterator local_13e8;
  iterator local_13d0;
  nullable local_13b8 [6];
  basic_variable<std::allocator<char>_> *local_13a0;
  basic_variable<std::allocator<char>_> local_1398;
  basic_variable<std::allocator<char>_> local_1368;
  basic_variable<std::allocator<char>_> local_1338;
  basic_variable<std::allocator<char>_> local_1308;
  basic_variable<std::allocator<char>_> local_12d8;
  basic_variable<std::allocator<char>_> local_12a8;
  basic_variable<std::allocator<char>_> local_1278;
  undefined1 local_1248 [24];
  variable expect_6;
  basic_variable<std::allocator<char>_> local_11d8;
  iterator local_11a0;
  iterator local_1188;
  iterator local_1168;
  iterator local_1150;
  iterator local_1138;
  iterator local_1120;
  nullable local_1104 [5];
  basic_variable<std::allocator<char>_> *local_10f0;
  basic_variable<std::allocator<char>_> local_10e8;
  basic_variable<std::allocator<char>_> local_10b8;
  basic_variable<std::allocator<char>_> local_1088;
  basic_variable<std::allocator<char>_> local_1058;
  basic_variable<std::allocator<char>_> local_1028;
  basic_variable<std::allocator<char>_> local_ff8;
  basic_variable<std::allocator<char>_> local_fc8;
  undefined1 local_f98 [24];
  variable expect_5;
  basic_variable<std::allocator<char>_> local_f28;
  iterator local_ef8;
  iterator local_ee0;
  iterator local_ec0;
  iterator local_ea8;
  iterator local_e90;
  iterator local_e78;
  nullable local_e60 [4];
  basic_variable<std::allocator<char>_> *local_e50;
  basic_variable<std::allocator<char>_> local_e48;
  basic_variable<std::allocator<char>_> local_e18;
  basic_variable<std::allocator<char>_> local_de8;
  basic_variable<std::allocator<char>_> local_db8;
  basic_variable<std::allocator<char>_> local_d88;
  basic_variable<std::allocator<char>_> local_d58;
  basic_variable<std::allocator<char>_> local_d28;
  undefined1 local_cf8 [24];
  variable expect_4;
  basic_variable<std::allocator<char>_> local_c88;
  iterator local_c58;
  iterator local_c40;
  iterator local_c20;
  iterator local_c08;
  iterator local_bf0;
  iterator local_bd8;
  nullable local_bbc [3];
  basic_variable<std::allocator<char>_> *local_bb0;
  basic_variable<std::allocator<char>_> local_ba8;
  basic_variable<std::allocator<char>_> local_b78;
  basic_variable<std::allocator<char>_> local_b48;
  basic_variable<std::allocator<char>_> local_b18;
  basic_variable<std::allocator<char>_> local_ae8;
  basic_variable<std::allocator<char>_> local_ab8;
  basic_variable<std::allocator<char>_> local_a88;
  undefined1 local_a58 [24];
  variable expect_3;
  basic_variable<std::allocator<char>_> local_9e8;
  iterator local_9b0;
  iterator local_998;
  iterator local_978;
  iterator local_960;
  iterator local_948;
  iterator local_930;
  nullable local_918 [2];
  basic_variable<std::allocator<char>_> *local_910;
  basic_variable<std::allocator<char>_> local_908;
  basic_variable<std::allocator<char>_> local_8d8;
  basic_variable<std::allocator<char>_> local_8a8;
  basic_variable<std::allocator<char>_> local_878;
  basic_variable<std::allocator<char>_> local_848;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7b8 [24];
  variable expect_2;
  basic_variable<std::allocator<char>_> local_748;
  iterator local_710;
  iterator local_6f8;
  iterator local_6d8;
  iterator local_6c0;
  iterator local_6a8;
  iterator local_690;
  nullable local_674;
  basic_variable<std::allocator<char>_> *local_670;
  basic_variable<std::allocator<char>_> local_668;
  basic_variable<std::allocator<char>_> local_638;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  basic_variable<std::allocator<char>_> local_578;
  basic_variable<std::allocator<char>_> local_548;
  undefined1 local_518 [24];
  variable expect_1;
  basic_variable<std::allocator<char>_> local_4a8;
  iterator local_478;
  iterator local_460;
  iterator local_440;
  iterator local_428;
  iterator local_410;
  iterator local_3f8;
  basic_variable<std::allocator<char>_> *local_3e0;
  basic_variable<std::allocator<char>_> local_3d8;
  basic_variable<std::allocator<char>_> local_3a8;
  basic_variable<std::allocator<char>_> local_378;
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  undefined1 local_288 [24];
  variable expect;
  basic_variable<std::allocator<char>_> local_218;
  iterator local_1e0;
  iterator local_1c8;
  basic_variable<std::allocator<char>_> *local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1a0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1a0,true);
  local_1a0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1a0,2);
  local_1a0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1a0,3.0);
  local_1a0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,"alpha");
  local_1a0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"bravo");
  local_1a0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"charlie");
  local_1a0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_16e0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_16e0 = local_16e0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_16e0);
  } while (local_16e0 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_218,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  puVar1 = &expect.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_1c8,&local_1e0,&local_218,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  local_3e0 = &local_3d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_3e0,true);
  local_3e0 = &local_3a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3e0,2);
  local_3e0 = &local_378;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_3e0,3.0);
  local_3e0 = &local_348;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3e0,"alpha");
  local_3e0 = &local_318;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3e0,L"bravo");
  local_3e0 = &local_2e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3e0,L"charlie");
  local_3e0 = &local_2b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3e0,L"delta");
  local_288._0_8_ = &local_3d8;
  local_288._8_8_ = 7;
  init_00._M_len = (size_type)puVar1;
  init_00._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_288 + 0x10),
             (basic_array<std::allocator<char>_> *)local_288._0_8_,init_00);
  local_16f8 = (basic_variable<std::allocator<char>_> *)local_288;
  do {
    local_16f8 = local_16f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_16f8);
  } while (local_16f8 != &local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_410,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_428,(basic_variable<std::allocator<char>_> *)(local_288 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_440,(basic_variable<std::allocator<char>_> *)(local_288 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x26c,"void replace_array()",&local_3f8,&local_410,&local_428,&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_288 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_460,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_478,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_1.storage.field_0x28);
  puVar1 = &expect_1.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_460,&local_478,&local_4a8,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_460);
  local_670 = &local_668;
  local_674 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_670,&local_674);
  local_670 = &local_638;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_670,2);
  local_670 = &local_608;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_670,3.0);
  local_670 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_670,"alpha");
  local_670 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_670,L"bravo");
  local_670 = &local_578;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_670,L"charlie");
  local_670 = &local_548;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_670,L"delta");
  local_518._0_8_ = &local_668;
  local_518._8_8_ = 7;
  init_01._M_len = (size_type)puVar1;
  init_01._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_518 + 0x10),
             (basic_array<std::allocator<char>_> *)local_518._0_8_,init_01);
  local_1710 = (basic_variable<std::allocator<char>_> *)local_518;
  do {
    local_1710 = local_1710 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1710);
  } while (local_1710 != &local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_690,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6c0,(basic_variable<std::allocator<char>_> *)(local_518 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6d8,(basic_variable<std::allocator<char>_> *)(local_518 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x273,"void replace_array()",&local_690,&local_6a8,&local_6c0,&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_518 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_710,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_748,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_2.storage.field_0x28);
  puVar1 = &expect_2.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_6f8,&local_710,&local_748,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6f8);
  local_910 = &local_908;
  local_918[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,local_918 + 1);
  local_910 = &local_8d8;
  local_918[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,local_918);
  local_910 = &local_8a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_910,3.0);
  local_910 = &local_878;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,"alpha");
  local_910 = &local_848;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,L"bravo");
  local_910 = &local_818;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,L"charlie");
  local_910 = &local_7e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,L"delta");
  local_7b8._0_8_ = &local_908;
  local_7b8._8_8_ = 7;
  init_02._M_len = (size_type)puVar1;
  init_02._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_7b8._0_8_,init_02);
  local_1728 = (basic_variable<std::allocator<char>_> *)local_7b8;
  do {
    local_1728 = local_1728 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1728);
  } while (local_1728 != &local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_930,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_948,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_960,(basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_978,(basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x27a,"void replace_array()",&local_930,&local_948,&local_960,&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_960);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_930);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_998,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_9b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_9e8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_3.storage.field_0x28);
  puVar1 = &expect_3.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_998,&local_9b0,&local_9e8,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_998);
  local_bb0 = &local_ba8;
  local_bbc[2] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,local_bbc + 2);
  local_bb0 = &local_b78;
  local_bbc[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,local_bbc + 1);
  local_bb0 = &local_b48;
  local_bbc[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,local_bbc);
  local_bb0 = &local_b18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,"alpha");
  local_bb0 = &local_ae8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,L"bravo");
  local_bb0 = &local_ab8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,L"charlie");
  local_bb0 = &local_a88;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_bb0,L"delta");
  local_a58._0_8_ = &local_ba8;
  local_a58._8_8_ = 7;
  init_03._M_len = (size_type)puVar1;
  init_03._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a58 + 0x10),
             (basic_array<std::allocator<char>_> *)local_a58._0_8_,init_03);
  local_1740 = (basic_variable<std::allocator<char>_> *)local_a58;
  do {
    local_1740 = local_1740 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1740);
  } while (local_1740 != &local_ba8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_bd8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_bf0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c08,(basic_variable<std::allocator<char>_> *)(local_a58 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c20,(basic_variable<std::allocator<char>_> *)(local_a58 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x281,"void replace_array()",&local_bd8,&local_bf0,&local_c08,&local_c20);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c20);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c08);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_bf0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a58 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c40,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c58,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c88,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_4.storage.field_0x28);
  puVar1 = &expect_4.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_c40,&local_c58,&local_c88,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c58);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c40);
  local_e50 = &local_e48;
  local_e60[3] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,local_e60 + 3);
  local_e50 = &local_e18;
  local_e60[2] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,local_e60 + 2);
  local_e50 = &local_de8;
  local_e60[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,local_e60 + 1);
  local_e50 = &local_db8;
  local_e60[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,local_e60);
  local_e50 = &local_d88;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,L"bravo");
  local_e50 = &local_d58;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,L"charlie");
  local_e50 = &local_d28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e50,L"delta");
  local_cf8._0_8_ = &local_e48;
  local_cf8._8_8_ = 7;
  init_04._M_len = (size_type)puVar1;
  init_04._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_cf8._0_8_,init_04);
  local_1758 = (basic_variable<std::allocator<char>_> *)local_cf8;
  do {
    local_1758 = local_1758 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1758);
  } while (local_1758 != &local_e48);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_e78,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_e90,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ea8,(basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ec0,(basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x288,"void replace_array()",&local_e78,&local_e90,&local_ea8,&local_ec0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ec0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ea8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ee0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ef8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_f28,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_5.storage.field_0x28);
  puVar1 = &expect_5.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_ee0,&local_ef8,&local_f28,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ef8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ee0);
  local_10f0 = &local_10e8;
  local_1104[4] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,local_1104 + 4);
  local_10f0 = &local_10b8;
  local_1104[3] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,local_1104 + 3);
  local_10f0 = &local_1088;
  local_1104[2] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,local_1104 + 2);
  local_10f0 = &local_1058;
  local_1104[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,local_1104 + 1);
  local_10f0 = &local_1028;
  local_1104[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,local_1104);
  local_10f0 = &local_ff8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,L"charlie");
  local_10f0 = &local_fc8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_10f0,L"delta");
  local_f98._0_8_ = &local_10e8;
  local_f98._8_8_ = 7;
  init_05._M_len = (size_type)puVar1;
  init_05._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_f98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_f98._0_8_,init_05);
  local_1770 = (basic_variable<std::allocator<char>_> *)local_f98;
  do {
    local_1770 = local_1770 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1770);
  } while (local_1770 != &local_10e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1150,(basic_variable<std::allocator<char>_> *)(local_f98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1168,(basic_variable<std::allocator<char>_> *)(local_f98 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x28f,"void replace_array()",&local_1120,&local_1138,&local_1150,&local_1168);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1168);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1150);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1120);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_f98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1188,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_11a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_11d8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_6.storage.field_0x28);
  puVar1 = &expect_6.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_1188,&local_11a0,&local_11d8,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_11d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_11a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1188);
  local_13a0 = &local_1398;
  local_13b8[5] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,local_13b8 + 5);
  local_13a0 = &local_1368;
  local_13b8[4] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,local_13b8 + 4);
  local_13a0 = &local_1338;
  local_13b8[3] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,local_13b8 + 3);
  local_13a0 = &local_1308;
  local_13b8[2] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,local_13b8 + 2);
  local_13a0 = &local_12d8;
  local_13b8[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,local_13b8 + 1);
  local_13a0 = &local_12a8;
  local_13b8[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,local_13b8);
  local_13a0 = &local_1278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_13a0,L"delta");
  local_1248._0_8_ = &local_1398;
  local_1248._8_8_ = 7;
  init_06._M_len = (size_type)puVar1;
  init_06._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1248 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1248._0_8_,init_06);
  local_1788 = (basic_variable<std::allocator<char>_> *)local_1248;
  do {
    local_1788 = local_1788 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1788);
  } while (local_1788 != &local_1398);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_13d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_13e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1400,(basic_variable<std::allocator<char>_> *)(local_1248 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1418,(basic_variable<std::allocator<char>_> *)(local_1248 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x296,"void replace_array()",&local_13d0,&local_13e8,&local_1400,&local_1418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_13e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_13d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1248 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1438,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1450,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1488,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_7.storage.field_0x28);
  puVar1 = &expect_7.storage.field_0x28;
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_1438,&local_1450,&local_1488,(basic_variable<std::allocator<char>_> *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1488);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1438);
  local_1650 = &local_1648;
  local_166c[6] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c + 6);
  local_1650 = &local_1618;
  local_166c[5] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c + 5);
  local_1650 = &local_15e8;
  local_166c[4] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c + 4);
  local_1650 = &local_15b8;
  local_166c[3] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c + 3);
  local_1650 = &local_1588;
  local_166c[2] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c + 2);
  local_1650 = &local_1558;
  local_166c[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c + 1);
  local_1650 = &local_1528;
  local_166c[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1650,local_166c);
  local_14f8._0_8_ = &local_1648;
  local_14f8._8_8_ = 7;
  init_07._M_len = (size_type)puVar1;
  init_07._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_14f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_14f8._0_8_,init_07);
  local_17a0 = (basic_variable<std::allocator<char>_> *)local_14f8;
  do {
    local_17a0 = local_17a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_17a0);
  } while (local_17a0 != &local_1648);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1688,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_16a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_16b8,(basic_variable<std::allocator<char>_> *)(local_14f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_16d0,(basic_variable<std::allocator<char>_> *)(local_14f8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x29d,"void replace_array()",&local_1688,&local_16a0,&local_16b8,&local_16d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_16d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_16b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_16a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1688);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_14f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void replace_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    std::replace(data.begin(), data.end(), variable(false), variable());
    {
        variable expect = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable(true), variable());
    {
        variable expect = array::make({ null, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable(2), variable());
    {
        variable expect = array::make({ null, null, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable(3.0), variable());
    {
        variable expect = array::make({ null, null, null, "alpha", L"bravo", u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable("alpha"), variable());
    {
        variable expect = array::make({ null, null, null, null, L"bravo", u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable(L"bravo"), variable());
    {
        variable expect = array::make({ null, null, null, null, null, u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable(u"charlie"), variable());
    {
        variable expect = array::make({ null, null, null, null, null, null, U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    std::replace(data.begin(), data.end(), variable(U"delta"), variable());
    {
        variable expect = array::make({ null, null, null, null, null, null, null });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}